

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

void soul::StructuralParser::recursivelyReplaceParentScope(Expression *target,Scope *newScope)

{
  undefined1 local_30 [8];
  ScopeReplacingVisitor v;
  Scope *newScope_local;
  Expression *target_local;
  
  v.newScope = newScope;
  recursivelyReplaceParentScope::ScopeReplacingVisitor::ScopeReplacingVisitor
            ((ScopeReplacingVisitor *)local_30);
  v.super_ASTVisitor._vptr_ASTVisitor =
       (_func_int **)(target->super_Statement).super_ASTObject.context.parentScope;
  v.oldScope = v.newScope;
  recursivelyReplaceParentScope(soul::AST::Expression&,soul::AST::Scope&)::ScopeReplacingVisitor::
  visitObject(soul::AST::Expression__((ScopeReplacingVisitor *)local_30,target);
  recursivelyReplaceParentScope::ScopeReplacingVisitor::~ScopeReplacingVisitor
            ((ScopeReplacingVisitor *)local_30);
  return;
}

Assistant:

static void recursivelyReplaceParentScope (AST::Expression& target, AST::Scope& newScope)
    {
        struct ScopeReplacingVisitor  : public ASTVisitor
        {
            void visitObject (AST::Expression& e) override
            {
                ASTVisitor::visitObject (e);

                if (e.context.parentScope == oldScope)
                    e.context.parentScope = newScope;
            }

            AST::Scope* oldScope;
            AST::Scope* newScope;
        };

        ScopeReplacingVisitor v;
        v.oldScope = target.context.parentScope;
        v.newScope = std::addressof (newScope);
        v.visitObject (target);
    }